

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# btree.h
# Opt level: O1

const_iterator __thiscall
phmap::priv::
btree<phmap::priv::map_params<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_int,_phmap::priv::(anonymous_namespace)::CompareIntToString,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_int>_>,_256,_true>_>
::upper_bound<char[2]>
          (btree<phmap::priv::map_params<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_int,_phmap::priv::(anonymous_namespace)::CompareIntToString,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_int>_>,_256,_true>_>
           *this,char (*key) [2])

{
  iterator iVar1;
  const_iterator cVar2;
  
  iVar1 = internal_upper_bound<char[2]>(this,key);
  if (iVar1.node ==
      (btree_node<phmap::priv::map_params<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_int,_phmap::priv::(anonymous_namespace)::CompareIntToString,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_int>_>,_256,_true>_>
       *)0x0) {
    iVar1 = (iterator)end(this);
  }
  cVar2.node = iVar1.node;
  cVar2.position = iVar1.position;
  cVar2._12_4_ = iVar1._12_4_;
  return cVar2;
}

Assistant:

const_iterator upper_bound(const K &key) const {
            return internal_end(internal_upper_bound(key));
        }